

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_api.c
# Opt level: O3

char * amqp_error_string2(int code)

{
  char **ppcVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = -code;
  uVar3 = uVar2 & 0xff;
  if ((char)(uVar2 >> 8) == '\x02') {
    if (5 < uVar3) {
      return "(unknown error)";
    }
    ppcVar1 = ssl_error_strings;
  }
  else {
    uVar2 = uVar2 >> 8 & 0xff;
    if (uVar2 == 1) {
      if (1 < uVar3) {
        return "(unknown error)";
      }
      ppcVar1 = tcp_error_strings;
    }
    else {
      if (uVar2 != 0) {
        return "(unknown error)";
      }
      if (0x14 < uVar3) {
        return "(unknown error)";
      }
      ppcVar1 = base_error_strings;
    }
  }
  return ppcVar1[uVar3];
}

Assistant:

const char *amqp_error_string2(int code) {
  const char *error_string;
  size_t category = (((-code) & ERROR_CATEGORY_MASK) >> 8);
  size_t error = (-code) & ERROR_MASK;

  switch (category) {
    case EC_base:
      if (error < (sizeof(base_error_strings) / sizeof(char *))) {
        error_string = base_error_strings[error];
      } else {
        error_string = unknown_error_string;
      }
      break;

    case EC_tcp:
      if (error < (sizeof(tcp_error_strings) / sizeof(char *))) {
        error_string = tcp_error_strings[error];
      } else {
        error_string = unknown_error_string;
      }
      break;

    case EC_ssl:
      if (error < (sizeof(ssl_error_strings) / sizeof(char *))) {
        error_string = ssl_error_strings[error];
      } else {
        error_string = unknown_error_string;
      }

      break;

    default:
      error_string = unknown_error_string;
      break;
  }

  return error_string;
}